

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void h2o_config_init(h2o_globalconf_t *config)

{
  h2o_hostconf_t **pphVar1;
  h2o_mimemap_t *phVar2;
  
  memset(config,0,0xf0);
  pphVar1 = (h2o_hostconf_t **)malloc(8);
  if (pphVar1 != (h2o_hostconf_t **)0x0) {
    config->hosts = pphVar1;
    *pphVar1 = (h2o_hostconf_t *)0x0;
    (config->configurators).prev = &config->configurators;
    (config->configurators).next = &config->configurators;
    (config->server_name).base = "h2o/2.2.5";
    (config->server_name).len = 9;
    config->max_request_entity_size = 0x40000000;
    config->max_delegations = 5;
    config->handshake_timeout = 10000;
    (config->http1).req_timeout = 10000;
    (config->http1).upgrade_to_http2 = 1;
    (config->http1).callbacks.request_shutdown = (_func_void_h2o_context_t_ptr *)0x0;
    (config->http1).callbacks.foreach_request = foreach_request;
    (config->http2).idle_timeout = 10000;
    (config->http2).graceful_shutdown_timeout = 0;
    (config->proxy).io_timeout = 30000;
    (config->proxy).field_0x10 = 0xc;
    (config->http2).max_concurrent_requests_per_connection = 100;
    (config->http2).max_streams_for_priority = 0x10;
    (config->http2).latency_optimization.min_rtt = 0x32;
    (config->http2).latency_optimization.max_additional_delay = 10;
    (config->http2).latency_optimization.max_cwnd = 0xffff;
    (config->http2).callbacks.request_shutdown = initiate_graceful_shutdown;
    (config->http2).callbacks.foreach_request = foreach_request;
    phVar2 = h2o_mimemap_create();
    config->mimemap = phVar2;
    h2o_configurator__init_core(config);
    return;
  }
  h2o__fatal(
            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
            );
}

Assistant:

void h2o_config_init(h2o_globalconf_t *config)
{
    memset(config, 0, sizeof(*config));
    config->hosts = h2o_mem_alloc(sizeof(config->hosts[0]));
    config->hosts[0] = NULL;
    h2o_linklist_init_anchor(&config->configurators);
    config->server_name = h2o_iovec_init(H2O_STRLIT("h2o/" H2O_VERSION));
    config->max_request_entity_size = H2O_DEFAULT_MAX_REQUEST_ENTITY_SIZE;
    config->max_delegations = H2O_DEFAULT_MAX_DELEGATIONS;
    config->handshake_timeout = H2O_DEFAULT_HANDSHAKE_TIMEOUT;
    config->http1.req_timeout = H2O_DEFAULT_HTTP1_REQ_TIMEOUT;
    config->http1.upgrade_to_http2 = H2O_DEFAULT_HTTP1_UPGRADE_TO_HTTP2;
    config->http1.callbacks = H2O_HTTP1_CALLBACKS;
    config->http2.idle_timeout = H2O_DEFAULT_HTTP2_IDLE_TIMEOUT;
    config->http2.graceful_shutdown_timeout = H2O_DEFAULT_HTTP2_GRACEFUL_SHUTDOWN_TIMEOUT;
    config->proxy.io_timeout = H2O_DEFAULT_PROXY_IO_TIMEOUT;
    config->proxy.emit_x_forwarded_headers = 1;
    config->proxy.emit_via_header = 1;
    config->http2.max_concurrent_requests_per_connection = H2O_HTTP2_SETTINGS_HOST.max_concurrent_streams;
    config->http2.max_streams_for_priority = 16;
    config->http2.latency_optimization.min_rtt = 50; // milliseconds
    config->http2.latency_optimization.max_additional_delay = 10;
    config->http2.latency_optimization.max_cwnd = 65535;
    config->http2.callbacks = H2O_HTTP2_CALLBACKS;
    config->mimemap = h2o_mimemap_create();

    h2o_configurator__init_core(config);
}